

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeHTTPRequest.h
# Opt level: O3

response<http::dynamic_body> *
make_http_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
          (response<http::dynamic_body> *__return_storage_ptr__,
          request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
          *request)

{
  header_holder_type *phVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  _func_int ***ppp_Var4;
  long *plVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  service *psVar13;
  execution_context eVar14;
  string_view sVar15;
  string_view host_00;
  string_view service;
  io_context ioc;
  string target;
  tcp_stream stream;
  string host;
  string port;
  results_type results;
  response<http::dynamic_body> res;
  flat_buffer buffer;
  resolver resolver;
  io_context local_1e8;
  long *local_1d8;
  size_t local_1d0;
  long local_1c8 [2];
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  local_1b8;
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  results_type local_168;
  undefined1 local_150 [16];
  undefined8 uStack_140;
  node_ptr local_138;
  undefined8 uStack_130;
  list_node<void_*> local_128;
  char *local_118;
  size_t sStack_110;
  char *local_108;
  size_t sStack_100;
  undefined8 local_f8;
  basic_multi_buffer<std::allocator<char>_> local_f0;
  basic_flat_buffer<std::allocator<char>_> local_a8;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_78;
  
  sVar15 = boost::beast::http::basic_fields<std::allocator<char>_>::at
                     ((basic_fields<std::allocator<char>_> *)request,host);
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,sVar15.ptr_,sVar15.ptr_ + sVar15.len_);
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"80","");
  lVar8 = std::__cxx11::string::find((char *)local_1a8,0x15abe3,0);
  if (lVar8 != -1) {
    std::__cxx11::string::substr((ulong)local_150,(ulong)local_1a8);
    std::__cxx11::string::operator=((string *)local_188,(string *)local_150);
    if ((undefined8 *)local_150._0_8_ != &uStack_140) {
      operator_delete((void *)local_150._0_8_,uStack_140 + 1);
    }
    std::__cxx11::string::substr((ulong)local_150,(ulong)local_1a8);
    std::__cxx11::string::operator=((string *)local_1a8,(string *)local_150);
    if ((undefined8 *)local_150._0_8_ != &uStack_140) {
      operator_delete((void *)local_150._0_8_,uStack_140 + 1);
    }
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::erase
            ((basic_fields<std::allocator<char>_> *)request,proxy_connection);
  sVar11 = (request->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.target_or_reason_.len_;
  lVar8 = 0;
  if (sVar11 != 0) {
    lVar8 = sVar11 - 1;
  }
  pcVar12 = (request->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
            super_basic_fields<std::allocator<char>_>.target_or_reason_.ptr_ + (sVar11 != 0);
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar12,pcVar12 + lVar8);
  iVar7 = 0;
  if (local_1d0 != 0) {
    sVar11 = 0;
    do {
      if ((*(char *)((long)local_1d8 + sVar11) == '/') && (iVar7 = iVar7 + 1, iVar7 == 3)) break;
      sVar11 = sVar11 + 1;
    } while (local_1d0 != sVar11);
  }
  std::__cxx11::string::substr((ulong)local_150,(ulong)&local_1d8);
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_150);
  if ((undefined8 *)local_150._0_8_ != &uStack_140) {
    operator_delete((void *)local_150._0_8_,uStack_140 + 1);
  }
  sVar15.len_ = local_1d0;
  sVar15.ptr_ = (char *)local_1d8;
  boost::beast::http::basic_fields<std::allocator<char>_>::realloc_target
            ((basic_fields<std::allocator<char>_> *)request,
             &(request->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              ).super_basic_fields<std::allocator<char>_>.target_or_reason_,sVar15);
  boost::asio::io_context::io_context(&local_1e8);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&local_78,&local_1e8,(type *)0x0);
  boost::
  make_shared<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>::impl_type,std::integral_constant<bool,false>,boost::asio::io_context&>
            ((boost *)&local_1b8,(integral_constant<bool,_false> *)local_150,&local_1e8);
  plVar5 = local_1a8[0];
  sVar9 = strlen((char *)local_1a8[0]);
  plVar6 = local_188[0];
  sVar10 = strlen((char *)local_188[0]);
  host_00._M_str = (char *)plVar5;
  host_00._M_len = sVar9;
  service._M_str = (char *)plVar6;
  service._M_len = sVar10;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve(&local_168,
            (basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&local_78,host_00,service,0);
  boost::beast::
  basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
  ::connect<boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,void>
            ((endpoint *)local_150,
             (basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>
              *)&local_1b8,&local_168);
  boost::beast::http::
  write<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (&local_1b8,request);
  local_a8.out_ = (char *)0x0;
  local_a8.last_ = (char *)0x0;
  local_a8.begin_ = (char *)0x0;
  local_a8.in_ = (char *)0x0;
  local_a8.end_ = (char *)0x0;
  local_a8.max_ = 0x7fffffffffffffff;
  uStack_140 = local_150 + 8;
  local_150[8] = '\0';
  local_150[9] = '\0';
  local_150[10] = '\0';
  local_150[0xb] = '\0';
  local_150[0xc] = '\0';
  local_150[0xd] = '\0';
  local_150[0xe] = '\0';
  local_150[0xf] = '\0';
  uStack_130._0_4_ = red_t;
  uStack_130._4_4_ = 0;
  local_150._0_8_ = 0;
  local_128.next_ = &local_128;
  local_118 = (char *)0x0;
  sStack_110 = 0;
  local_108 = (char *)0x0;
  sStack_100 = 0;
  local_f8._0_4_ = 0xb;
  local_f8._4_4_ = ok;
  local_f0.max_ = 0xfffffffffffffff;
  phVar1 = &local_f0.list_.data_.root_plus_size_.m_header;
  local_f0.list_.data_.root_plus_size_.super_size_traits.size_ = 0;
  local_f0.in_size_ = 0;
  local_f0.in_pos_ = 0;
  local_f0.out_pos_ = 0;
  local_f0.out_end_ = 0;
  local_138 = (node_ptr)uStack_140;
  local_128.prev_ = local_128.next_;
  local_f0.list_.data_.root_plus_size_.m_header.super_node.next_ = &phVar1->super_node;
  local_f0.list_.data_.root_plus_size_.m_header.super_node.prev_ = &phVar1->super_node;
  local_f0.out_.members_.nodeptr_ =
       (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::beast::basic_multi_buffer<std::allocator<char>_>::element,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>_*,_false>
        )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<boost::beast::basic_multi_buffer<std::allocator<char>_>::element,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>_*,_false>
          )phVar1;
  boost::beast::http::
  read<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,std::allocator<char>>
            (&local_1b8,&local_a8,
             (message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_150);
  boost::beast::http::basic_fields<std::allocator<char>_>::basic_fields
            ((basic_fields<std::allocator<char>_> *)__return_storage_ptr__,
             (basic_fields<std::allocator<char>_> *)local_150);
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).version_ =
       (uint)local_f8;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).result_ =
       local_f8._4_4_;
  boost::beast::basic_multi_buffer<std::allocator<char>_>::basic_multi_buffer
            (&(__return_storage_ptr__->
              super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>)
              .value_,&local_f0);
  plVar3 = local_f0.list_.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar3 != &phVar1->super_node) {
    plVar2 = ((node *)&plVar3->next_)->next_;
    operator_delete(plVar3,(ulong)((long)&plVar3[1].next_[1].prev_ + 7) & 0xfffffffffffffff8);
    plVar3 = plVar2;
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)local_150);
  if (local_a8.begin_ != (char *)0x0) {
    operator_delete(local_a8.begin_,(long)local_a8.end_ - (long)local_a8.begin_);
  }
  if (local_168.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
               super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  boost::beast::
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  ::~basic_stream(&local_1b8);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_78);
  psVar13 = (local_1e8.super_execution_context.service_registry_)->first_service_;
  eVar14.service_registry_ = local_1e8.super_execution_context.service_registry_;
  if (psVar13 != (service *)0x0) {
    do {
      (*psVar13->_vptr_service[2])(psVar13);
      eVar14.service_registry_ = local_1e8.super_execution_context.service_registry_;
      psVar13 = psVar13->next_;
    } while (psVar13 != (service *)0x0);
    psVar13 = (local_1e8.super_execution_context.service_registry_)->first_service_;
    if (psVar13 != (service *)0x0) {
      do {
        ppp_Var4 = &psVar13->_vptr_service;
        psVar13 = psVar13->next_;
        (*(*ppp_Var4)[1])();
        (eVar14.service_registry_)->first_service_ = psVar13;
      } while (psVar13 != (service *)0x0);
      eVar14.service_registry_ = local_1e8.super_execution_context.service_registry_;
      if (local_1e8.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar14.service_registry_ = (service_registry *)0x0;
        goto LAB_0014fab0;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar14.service_registry_)->mutex_);
LAB_0014fab0:
  operator_delete(eVar14.service_registry_,0x40);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_http_request(http::request<Body, http::basic_fields<Allocator>>&& request) {
    int version = 11;

    std::string host = request.at(http::field::host).to_string();
    std::string port = "80";
    auto pos = host.find(":");
    // port detect
    if (pos != std::string::npos) {
        port = host.substr(pos + 1, host.length());
        host = host.substr(0, pos);
    }

    request.erase(http::field::proxy_connection);

    // http://mail.ru/news/ -> /news/
    std::string target(request.target());
    int i = 0;
    for (int j = 0; i < target.length(); i++) {
        if (target[i] == '/') {
            j++;
            if (j == 3) {
                break;
            }
        }
    }

    target = target.substr(i, target.length());

    request.target(target);

    // The io_context is required for all I/O
    net::io_context ioc;

    // These objects perform our I/O
    tcp::resolver resolver(ioc);
    beast::tcp_stream stream(ioc);

    // Look up the domain name
    // msg.at
    auto const results = resolver.resolve(host.c_str(), port.c_str());

    // Make the connection on the IP address we get from a lookup
    beast::get_lowest_layer(stream).connect(results);

    // Send the HTTP request to the remote host
    http::write(stream, request);

    // This buffer is used for reading and must be persisted
    beast::flat_buffer buffer;

    // Declare a container to hold the response
    http::response<http::dynamic_body> res;

    // Receive the HTTP response
    http::read(stream, buffer, res);

    return res;
}